

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O0

gdImagePtr gdImageCreateFromWBMPCtx(gdIOCtx *infile)

{
  int iVar1;
  int color;
  gdImagePtr im_00;
  int local_3c;
  int local_38;
  int pos;
  int row;
  int col;
  int white;
  int black;
  gdImagePtr im;
  Wbmp *wbmp;
  gdIOCtx *infile_local;
  
  wbmp = (Wbmp *)infile;
  iVar1 = readwbmp(gd_getin,infile,(Wbmp **)&im);
  if (iVar1 == 0) {
    im_00 = gdImageCreate(*(int *)((long)&im->pixels + 4),im->sx);
    if (im_00 == (gdImagePtr)0x0) {
      freewbmp((Wbmp *)im);
      infile_local = (gdIOCtx *)0x0;
    }
    else {
      iVar1 = gdImageColorAllocate(im_00,0xff,0xff,0xff);
      color = gdImageColorAllocate(im_00,0,0,0);
      local_3c = 0;
      for (local_38 = 0; local_38 < im->sx; local_38 = local_38 + 1) {
        for (pos = 0; pos < *(int *)((long)&im->pixels + 4); pos = pos + 1) {
          if (*(int *)(*(long *)&im->colorsTotal + (long)local_3c * 4) == 1) {
            gdImageSetPixel(im_00,pos,local_38,iVar1);
          }
          else {
            gdImageSetPixel(im_00,pos,local_38,color);
          }
          local_3c = local_3c + 1;
        }
      }
      freewbmp((Wbmp *)im);
      infile_local = (gdIOCtx *)im_00;
    }
  }
  else {
    infile_local = (gdIOCtx *)0x0;
  }
  return (gdImagePtr)infile_local;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromWBMPCtx(gdIOCtx *infile)
{
	Wbmp *wbmp;
	gdImagePtr im = NULL;
	int black, white;
	int col, row, pos;

	if(readwbmp(&gd_getin, infile, &wbmp)) {
		return (NULL);
	}

	if(!(im = gdImageCreate(wbmp->width, wbmp->height))) {
		freewbmp(wbmp);
		return NULL;
	}

	/* create the background color */
	white = gdImageColorAllocate(im, 255, 255, 255);
	/* create foreground color */
	black = gdImageColorAllocate(im, 0, 0, 0);

	/* fill in image (in a wbmp 1 = white/ 0 = black) */
	pos = 0;
	for(row = 0; row < wbmp->height; row++) {
		for(col = 0; col < wbmp->width; col++) {
			if(wbmp->bitmap[pos++] == WBMP_WHITE) {
				gdImageSetPixel(im, col, row, white);
			} else {
				gdImageSetPixel(im, col, row, black);
			}
		}
	}

	freewbmp(wbmp);

	return im;
}